

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::PrintStats(LinearScan *this)

{
  Instr *this_00;
  Opnd *pOVar1;
  code *pcVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  undefined4 *puVar6;
  LabelInstr *pLVar7;
  BranchInstr *this_01;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  Instr *pIVar10;
  uint uVar11;
  Instr **ppIVar12;
  byte bVar13;
  ulong local_50;
  uint local_48;
  uint local_44;
  ulong local_40;
  uint local_34;
  
  ppIVar12 = &this->func->m_tailInstr;
  local_40 = 0;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_48 = 0;
  bVar13 = 0;
  local_50 = 0;
  local_34 = 0;
  local_44 = 0;
  uVar11 = 0;
  pIVar10 = (Instr *)0x0;
  while( true ) {
    this_00 = *ppIVar12;
    if (this_00 == (Instr *)0x0) break;
    if ((pIVar10 != (Instr *)0x0) && (pIVar10->m_prev != this_00)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1274,
                         "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar5) goto LAB_00531931;
      *puVar6 = 0;
    }
    switch(this_00->m_kind) {
    case InstrKindBranch:
      this_01 = IR::Instr::AsBranchInstr(this_00);
      bVar5 = IR::BranchInstr::IsLoopTail(this_01,this->func);
      uVar11 = uVar11 + bVar5;
      local_48 = local_48 + 1;
      break;
    case InstrKindLabel:
    case InstrKindProfiledLabel:
      pLVar7 = IR::Instr::AsLabelInstr(this_00);
      if ((pLVar7->field_0x78 & 1) != 0) {
        if (uVar11 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x1288,"(loopNest)","loopNest");
          if (!bVar5) goto LAB_00531931;
          *puVar6 = 0;
        }
        uVar11 = uVar11 - 1;
      }
      pLVar7 = IR::Instr::AsLabelInstr(this_00);
      bVar13 = (byte)pLVar7->field_0x78 >> 1;
      break;
    default:
      bVar5 = IR::Instr::IsRealInstr(this_00);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x1291,"(instr->IsRealInstr())","instr->IsRealInstr()");
        if (!bVar5) goto LAB_00531931;
        *puVar6 = 0;
      }
      if ((bVar13 & 1) == 0) {
        pOVar1 = this_00->m_dst;
        cVar4 = (char)uVar11;
        if (((pOVar1 != (Opnd *)0x0) && (bVar5 = IR::Opnd::IsSymOpnd(pOVar1), bVar5)) &&
           (pSVar8 = IR::Opnd::AsSymOpnd(pOVar1), pSVar8->m_sym->m_kind == SymKindStack)) {
          pSVar8 = IR::Opnd::AsSymOpnd(pOVar1);
          pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
          if ((pSVar9->field_0x19 & 0x10) != 0) {
            local_44 = local_44 + 1;
            iVar3 = uVar11 * 0x8000 + -0x28000;
            if (uVar11 < 6) {
              iVar3 = 1 << (cVar4 * '\x03' & 0x1fU);
            }
            local_50 = (ulong)(uint)((int)local_50 + iVar3);
          }
        }
        pOVar1 = this_00->m_src1;
        if (pOVar1 != (Opnd *)0x0) {
          bVar5 = IR::Opnd::IsSymOpnd(pOVar1);
          if ((bVar5) &&
             (pSVar8 = IR::Opnd::AsSymOpnd(pOVar1), pSVar8->m_sym->m_kind == SymKindStack)) {
            pSVar8 = IR::Opnd::AsSymOpnd(pOVar1);
            pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
            if ((pSVar9->field_0x19 & 0x10) != 0) {
              local_34 = local_34 + 1;
              iVar3 = uVar11 * 0x8000 + -0x28000;
              if (uVar11 < 6) {
                iVar3 = 1 << (cVar4 * '\x03' & 0x1fU);
              }
              local_40 = (ulong)(uint)((int)local_40 + iVar3);
            }
          }
          pOVar1 = this_00->m_src2;
          if (((pOVar1 != (Opnd *)0x0) && (bVar5 = IR::Opnd::IsSymOpnd(pOVar1), bVar5)) &&
             (pSVar8 = IR::Opnd::AsSymOpnd(pOVar1), pSVar8->m_sym->m_kind == SymKindStack)) {
            pSVar8 = IR::Opnd::AsSymOpnd(pOVar1);
            pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
            if ((pSVar9->field_0x19 & 0x10) != 0) {
              local_34 = local_34 + 1;
              iVar3 = uVar11 * 0x8000 + -0x28000;
              if (uVar11 < 6) {
                iVar3 = 1 << (cVar4 * '\x03' & 0x1fU);
              }
              local_40 = (ulong)(uint)((int)local_40 + iVar3);
            }
          }
        }
      }
      break;
    case InstrKindPragma:
      break;
    }
    ppIVar12 = &this_00->m_prev;
    pIVar10 = this_00;
  }
  if (uVar11 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x12b2,"(loopNest == 0)","loopNest == 0");
    if (!bVar5) {
LAB_00531931:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  Func::DumpFullFunctionName(this->func);
  Output::SkipToColumn(0x2d);
  Output::Print(L"Instrs:%5d, Lds:%4d, Strs:%4d, WLds: %4d, WStrs: %4d, WRefs: %4d\n",
                (ulong)local_48,(ulong)local_34,(ulong)local_44,local_40,local_50,
                (int)local_50 + (int)local_40);
  return;
}

Assistant:

void LinearScan::PrintStats() const
{
    uint loopNest = 0;
    uint storeCount = 0;
    uint loadCount = 0;
    uint wStoreCount = 0;
    uint wLoadCount = 0;
    uint instrCount = 0;
    bool isInHelper = false;

    FOREACH_INSTR_IN_FUNC_BACKWARD(instr, this->func)
    {
        switch (instr->GetKind())
        {
        case IR::InstrKindPragma:
            continue;

        case IR::InstrKindBranch:
            if (instr->AsBranchInstr()->IsLoopTail(this->func))
            {
                loopNest++;
            }

            instrCount++;
            break;

        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                Assert(loopNest);
                loopNest--;
            }

            isInHelper = instr->AsLabelInstr()->isOpHelper;
            break;

        default:
            {
                Assert(instr->IsRealInstr());

                if (isInHelper)
                {
                    continue;
                }

                IR::Opnd *dst = instr->GetDst();
                if (dst && dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsStackSym() && dst->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                {
                    storeCount++;
                    wStoreCount += LinearScan::GetUseSpillCost(loopNest, false);
                }
                IR::Opnd *src1 = instr->GetSrc1();
                if (src1)
                {
                    if (src1->IsSymOpnd() && src1->AsSymOpnd()->m_sym->IsStackSym() && src1->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                    {
                        loadCount++;
                        wLoadCount += LinearScan::GetUseSpillCost(loopNest, false);
                    }
                    IR::Opnd *src2 = instr->GetSrc2();
                    if (src2 && src2->IsSymOpnd() && src2->AsSymOpnd()->m_sym->IsStackSym() && src2->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                    {
                        loadCount++;
                        wLoadCount += LinearScan::GetUseSpillCost(loopNest, false);
                    }
                }
            }
            break;
        }
    } NEXT_INSTR_IN_FUNC_BACKWARD;

    Assert(loopNest == 0);

    this->func->DumpFullFunctionName();
    Output::SkipToColumn(45);

    Output::Print(_u("Instrs:%5d, Lds:%4d, Strs:%4d, WLds: %4d, WStrs: %4d, WRefs: %4d\n"),
        instrCount, loadCount, storeCount, wLoadCount, wStoreCount, wLoadCount+wStoreCount);
}